

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_asm_x86.h
# Opt level: O0

void asm_gc_check(ASMState *as)

{
  MCLabel target;
  Reg RVar1;
  Reg r;
  Reg tmp;
  MCLabel l_end;
  IRRef args [2];
  CCallInfo *ci;
  ASMState *as_local;
  
  args[0] = 0x1d4b90;
  args[1] = 0;
  ra_evictset(as,0xffff0fc7);
  target = as->mcp;
  asm_guardcc(as,5);
  emit_rr(as,XO_TEST,0,0);
  l_end._0_4_ = 0x7ffd;
  l_end._4_4_ = 0x7ffe;
  asm_gencall(as,(CCallInfo *)args,(IRRef *)&l_end);
  RVar1 = ra_releasetmp(as,0x7ffd);
  emit_rmro(as,XO_LEA,RVar1 | 0x80200,0xe,-0xf80);
  r = ra_releasetmp(as,0x7ffe);
  emit_loadi(as,r,as->gcsteps);
  emit_sjcc(as,2,target);
  emit_rma(as,XO_CMP,RVar1 | 0x80200,&as->J[-1].penalty[0x24].val);
  emit_rma(as,XO_MOV,RVar1 | 0x80200,as->J[-1].penalty + 0x24);
  as->gcsteps = 0;
  if (as->mclim <= as->mcp) {
    return;
  }
  asm_mclimit(as);
}

Assistant:

static void asm_gc_check(ASMState *as)
{
  const CCallInfo *ci = &lj_ir_callinfo[IRCALL_lj_gc_step_jit];
  IRRef args[2];
  MCLabel l_end;
  Reg tmp;
  ra_evictset(as, RSET_SCRATCH);
  l_end = emit_label(as);
  /* Exit trace if in GCSatomic or GCSfinalize. Avoids syncing GC objects. */
  asm_guardcc(as, CC_NE);  /* Assumes asm_snap_prep() already done. */
  emit_rr(as, XO_TEST, RID_RET, RID_RET);
  args[0] = ASMREF_TMP1;  /* global_State *g */
  args[1] = ASMREF_TMP2;  /* MSize steps     */
  asm_gencall(as, ci, args);
  tmp = ra_releasetmp(as, ASMREF_TMP1);
#if LJ_GC64
  emit_rmro(as, XO_LEA, tmp|REX_64, RID_DISPATCH, GG_DISP2G);
#else
  emit_loada(as, tmp, J2G(as->J));
#endif
  emit_loadi(as, ra_releasetmp(as, ASMREF_TMP2), as->gcsteps);
  /* Jump around GC step if GC total < GC threshold. */
  emit_sjcc(as, CC_B, l_end);
  emit_opgl(as, XO_ARITH(XOg_CMP), tmp|REX_GC64, gc.threshold);
  emit_getgl(as, tmp, gc.total);
  as->gcsteps = 0;
  checkmclim(as);
}